

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_atan2>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float *pfVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int extraout_EAX;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  float fVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar14;
  binary_op_atan2 op;
  __m128 _p1;
  __m128 _p;
  binary_op_atan2 local_ad;
  int local_ac;
  void *local_a8;
  Mat *local_a0;
  float local_98 [2];
  float afStack_90 [2];
  float local_88 [2];
  float afStack_80 [4];
  long local_70;
  long local_68;
  long local_60;
  void *local_58;
  Mat *local_50;
  Mat *local_48;
  long local_40;
  long local_38;
  
  iVar4 = a->c;
  local_40 = (long)iVar4;
  if (0 < local_40) {
    local_ac = a->h * a->w * a->d * a->elempack;
    local_38 = 0;
    local_a0 = a;
    local_50 = b;
    local_48 = c;
    do {
      pvVar9 = a->data;
      local_a8 = (void *)a->elemsize;
      pvVar12 = local_50->data;
      pvVar2 = local_48->data;
      if (local_ac < 4) {
        pvVar9 = (void *)((long)pvVar9 + a->cstep * local_38 * (long)local_a8);
        pvVar12 = (void *)((long)pvVar12 + local_50->cstep * local_38 * local_50->elemsize);
        lVar5 = local_48->cstep * local_38 * local_48->elemsize;
        iVar4 = 0;
      }
      else {
        lVar5 = local_48->cstep * local_48->elemsize * local_38;
        lVar7 = local_50->cstep * local_50->elemsize * local_38;
        lVar11 = a->cstep * (long)local_a8 * local_38;
        lVar8 = 0;
        iVar6 = 0;
        local_a8 = pvVar9;
        local_70 = lVar5;
        local_68 = lVar7;
        local_60 = lVar11;
        local_58 = pvVar12;
        do {
          pfVar1 = (float *)((long)pvVar9 + lVar8 + lVar11);
          local_88 = *(float (*) [2])pfVar1;
          afStack_80._0_8_ = *(undefined8 *)(pfVar1 + 2);
          pfVar1 = (float *)((long)pvVar12 + lVar8 + lVar7);
          local_98 = *(float (*) [2])pfVar1;
          afStack_90 = *(float (*) [2])(pfVar1 + 2);
          afVar14 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                              (&local_ad,(__m128 *)local_88,(__m128 *)local_98);
          auVar3._8_4_ = extraout_XMM0_Dc;
          auVar3._0_8_ = afVar14._0_8_;
          auVar3._12_4_ = extraout_XMM0_Dd;
          *(undefined1 (*) [16])((long)pvVar2 + lVar8 + lVar5) = auVar3;
          iVar4 = iVar6 + 4;
          iVar10 = iVar6 + 7;
          lVar8 = lVar8 + 0x10;
          iVar6 = iVar4;
        } while (iVar10 < local_ac);
        lVar5 = local_70 + lVar8;
        pvVar12 = (void *)((long)local_58 + local_68 + lVar8);
        pvVar9 = (void *)((long)local_a8 + local_60 + lVar8);
      }
      a = local_a0;
      iVar6 = local_ac - iVar4;
      if (iVar4 < local_ac) {
        lVar7 = 0;
        do {
          fVar13 = atan2f(*(float *)((long)pvVar9 + lVar7 * 4),*(float *)((long)pvVar12 + lVar7 * 4)
                         );
          *(float *)((long)pvVar2 + lVar7 * 4 + lVar5) = fVar13;
          lVar7 = lVar7 + 1;
          iVar4 = extraout_EAX;
        } while (iVar6 != (int)lVar7);
      }
      local_38 = local_38 + 1;
    } while (local_38 != local_40);
  }
  return iVar4;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}